

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example01.c
# Opt level: O1

int main(void)

{
  double dVar1;
  flexfloat_t ff_c;
  flexfloat_t n4;
  flexfloat_t n3;
  flexfloat_t n2;
  flexfloat_t n1;
  flexfloat_t ff_b;
  flexfloat_t ff_a;
  flexfloat_t fStack_88;
  flexfloat_t local_78;
  flexfloat_t local_68;
  flexfloat_t local_58;
  flexfloat_t local_48;
  flexfloat_t local_38;
  flexfloat_t local_28;
  
  ff_init_double(&local_28,10.4,(flexfloat_desc_t)0x340b);
  ff_init_double(&local_38,11.5,(flexfloat_desc_t)0x340b);
  ff_init(&fStack_88,(flexfloat_desc_t)0x340b);
  ff_add(&fStack_88,&local_28,&local_38);
  ff_get_double(&fStack_88);
  printf("[printf] ff_c = %f\n");
  dVar1 = ff_get_double(&fStack_88);
  if (dVar1 == 21.9) {
    puts("checksum ok");
  }
  else {
    printf("checksum WRONG!!!");
  }
  ff_init_double(&local_48,1.11,(flexfloat_desc_t)0xa05);
  ff_init_double(&local_58,3.754,(flexfloat_desc_t)0xa05);
  ff_init(&local_68,(flexfloat_desc_t)0xa05);
  ff_add(&local_68,&local_48,&local_58);
  ff_get_double(&local_68);
  printf("n1+n2 = %f\n");
  ff_cast(&local_68,&fStack_88,(flexfloat_desc_t)0xa05);
  ff_get_double(&local_68);
  printf("n3 = %f\n");
  ff_cast(&local_78,&local_68,(flexfloat_desc_t)0x708);
  ff_get_double(&local_78);
  printf("n4 = %f\n");
  return 0;
}

Assistant:

int main(){

    double dbl;

    // Double-precision variables
    flexfloat_t ff_a, ff_b, ff_c;
    ff_init_double(&ff_a, 10.4, (flexfloat_desc_t) {11, 52});
    ff_init_double(&ff_b, 11.5, (flexfloat_desc_t) {11, 52});
    ff_init(&ff_c, (flexfloat_desc_t) {11, 52});
    // Arithmetic operators
    ff_add(&ff_c, &ff_a, &ff_b); // c=a+b
    // C-style printf (it requires an explicit cast)
    printf("[printf] ff_c = %f\n", ff_get_double(&ff_c));
    // checksum with double result
    if(ff_get_double(&ff_c) == (10.4+11.5)) printf("checksum ok\n");
    else printf("checksum WRONG!!!");

    // IEEE float16: 5 bits (exponent) + 10 bits (explicit mantissa)
    flexfloat_t n1, n2, n3;
    ff_init_double(&n1, 1.11, (flexfloat_desc_t) {5, 10});
    ff_init_double(&n2, 3.754, (flexfloat_desc_t) {5, 10});
    ff_init(&n3, (flexfloat_desc_t) {5, 10});

    ff_add(&n3, &n1, &n2);
    printf("n1+n2 = %f\n", ff_get_double(&n3));
    // Automatic cast from different precisions
    ff_cast(&n3, &ff_c, (flexfloat_desc_t) {5, 10}); //  n3 = ff_c;
    printf("n3 = %f\n", ff_get_double(&n3));

    // float16 with extended dynamic: : 8 bits (exponent) + 7 bits (explicit mantissa)
    flexfloat_t n4;
    ff_cast(&n4, &n3, (flexfloat_desc_t) {8, 7}); // n4 = n3
    printf("n4 = %f\n", ff_get_double(&n4));

    return 0;
}